

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman.c
# Opt level: O1

void BZ2_hbMakeCodeLengths(UChar *len,Int32 *freq,Int32 alphaSize,Int32 maxLen)

{
  bool bVar1;
  Int32 tmp;
  ulong uVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  Int32 tmp_1;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  Int32 tmp_2;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  Int32 heap [260];
  Int32 weight [516];
  Int32 parent [516];
  uint local_1468 [260];
  uint local_1058 [516];
  undefined4 local_848;
  uint local_844 [517];
  
  uVar11 = (ulong)(uint)alphaSize;
  if (0 < alphaSize) {
    uVar2 = 0;
    do {
      uVar8 = freq[uVar2] << 8;
      if (freq[uVar2] == 0) {
        uVar8 = 0x100;
      }
      local_1058[uVar2 + 1] = uVar8;
      uVar2 = uVar2 + 1;
    } while (uVar11 != uVar2);
  }
  do {
    local_1468[0] = 0;
    local_1058[0] = 0;
    local_848 = 0xfffffffe;
    uVar2 = 0;
    if (0 < alphaSize) {
      memset(local_844,0xff,uVar11 * 4);
      lVar3 = 1;
      uVar2 = 0;
      do {
        local_1468[uVar2 + 1] = (uint)lVar3;
        uVar2 = uVar2 + 1;
        uVar8 = local_1058[lVar3];
        uVar5 = uVar2 >> 1 & 0x7fffffff;
        lVar7 = (long)(int)local_1468[uVar5];
        uVar6 = uVar2 & 0xffffffff;
        if ((int)uVar8 < (int)local_1058[lVar7]) {
          uVar12 = uVar2 & 0xffffffff;
          do {
            uVar6 = uVar5;
            local_1468[uVar12] = (uint)lVar7;
            lVar7 = (long)(int)local_1468[uVar6 >> 1];
            uVar5 = uVar6 >> 1;
            uVar12 = uVar6;
          } while ((int)uVar8 < (int)local_1058[lVar7]);
        }
        local_1468[uVar6] = (uint)lVar3;
        lVar3 = lVar3 + 1;
      } while (uVar2 != uVar11);
    }
    if (0x103 < (uint)uVar2) {
      BZ2_bz__AssertH__fail(0x7d1);
    }
    uVar5 = (ulong)(uint)alphaSize;
    if (1 < (int)(uint)uVar2) {
      uVar2 = uVar2 & 0xffffffff;
      uVar6 = (long)alphaSize;
      do {
        lVar3 = (long)(int)local_1468[1];
        uVar8 = local_1468[uVar2];
        local_1468[1] = uVar8;
        uVar12 = uVar2 - 1;
        lVar7 = 1;
        lVar14 = 1;
        if (2 < (long)uVar2) {
          uVar17 = local_1058[(int)uVar8];
          uVar10 = 2;
          uVar9 = 1;
          do {
            if (((long)uVar12 <= (long)(int)uVar10) ||
               (uVar13 = uVar10 | 1,
               (int)local_1058[(int)local_1468[(int)uVar10]] <=
               (int)local_1058[(int)local_1468[(int)(uVar10 | 1)]])) {
              uVar13 = uVar10;
            }
            if ((int)uVar17 < (int)local_1058[(int)local_1468[(int)uVar13]]) break;
            local_1468[(int)uVar9] = local_1468[(int)uVar13];
            uVar10 = uVar13 * 2;
            uVar9 = uVar13;
          } while ((long)(int)uVar10 < (long)uVar2);
          lVar14 = (long)(int)uVar9;
        }
        local_1468[lVar14] = uVar8;
        lVar14 = (long)(int)local_1468[1];
        uVar8 = local_1468[uVar12];
        local_1468[1] = uVar8;
        if (3 < (long)uVar2) {
          uVar10 = local_1058[(int)uVar8];
          uVar17 = 2;
          uVar9 = 1;
          do {
            if (((long)(uVar2 - 2) <= (long)(int)uVar17) ||
               (uVar13 = uVar17 | 1,
               (int)local_1058[(int)local_1468[(int)uVar17]] <=
               (int)local_1058[(int)local_1468[(int)(uVar17 | 1)]])) {
              uVar13 = uVar17;
            }
            if ((int)uVar10 < (int)local_1058[(int)local_1468[(int)uVar13]]) break;
            local_1468[(int)uVar9] = local_1468[(int)uVar13];
            uVar17 = uVar13 * 2;
            uVar9 = uVar13;
          } while ((long)(int)uVar17 <= (long)(uVar2 - 2));
          lVar7 = (long)(int)uVar9;
        }
        local_1468[lVar7] = uVar8;
        uVar5 = uVar6 + 1;
        uVar9 = (uint)uVar5;
        local_844[lVar14 + -1] = uVar9;
        uVar8 = local_1058[lVar3];
        uVar17 = local_1058[lVar14];
        uVar13 = uVar8 & 0xff;
        uVar10 = uVar17 & 0xff;
        if (uVar10 < uVar13) {
          uVar10 = uVar13;
        }
        local_844[lVar3 + -1] = uVar9;
        uVar8 = uVar10 + 1 | (uVar17 & 0xffffff00) + (uVar8 & 0xffffff00);
        local_1058[uVar6 + 1] = uVar8;
        local_844[uVar6] = 0xffffffff;
        local_1468[uVar12] = uVar9;
        uVar6 = uVar12 >> 1 & 0x7fffffff;
        lVar3 = (long)(int)local_1468[uVar6];
        uVar15 = uVar12 & 0xffffffff;
        if ((int)uVar8 < (int)local_1058[lVar3]) {
          uVar16 = uVar12 & 0xffffffff;
          do {
            uVar15 = uVar6;
            local_1468[uVar16] = (uint)lVar3;
            lVar3 = (long)(int)local_1468[uVar15 >> 1];
            uVar6 = uVar15 >> 1;
            uVar16 = uVar15;
          } while ((int)uVar8 < (int)local_1058[lVar3]);
        }
        local_1468[uVar15] = uVar9;
        bVar1 = 2 < (long)uVar2;
        uVar2 = uVar12;
        uVar6 = uVar5;
      } while (bVar1);
    }
    if (0x203 < (int)uVar5) {
      BZ2_bz__AssertH__fail(0x7d2);
    }
    if (alphaSize < 1) {
      return;
    }
    uVar2 = 1;
    bVar1 = false;
    do {
      iVar4 = -1;
      uVar5 = uVar2 & 0xffffffff;
      do {
        lVar3 = uVar5 - 1;
        uVar5 = (ulong)local_844[lVar3];
        iVar4 = iVar4 + 1;
      } while (-1 < (int)local_844[lVar3]);
      len[uVar2 - 1] = (UChar)iVar4;
      if (maxLen < iVar4) {
        bVar1 = true;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 != alphaSize + 1);
    if (!bVar1) {
      return;
    }
    if (0 < alphaSize) {
      uVar2 = 1;
      do {
        local_1058[uVar2] =
             (((int)local_1058[uVar2] >> 8) - ((int)local_1058[uVar2] >> 0x1f) & 0xfffffffeU) * 0x80
             + 0x100;
        uVar2 = uVar2 + 1;
      } while (alphaSize + 1 != uVar2);
    }
  } while( true );
}

Assistant:

void BZ2_hbMakeCodeLengths ( UChar *len, 
                             Int32 *freq,
                             Int32 alphaSize,
                             Int32 maxLen )
{
   /*--
      Nodes and heap entries run from 1.  Entry 0
      for both the heap and nodes is a sentinel.
   --*/
   Int32 nNodes, nHeap, n1, n2, i, j, k;
   Bool  tooLong;

   Int32 heap   [ BZ_MAX_ALPHA_SIZE + 2 ];
   Int32 weight [ BZ_MAX_ALPHA_SIZE * 2 ];
   Int32 parent [ BZ_MAX_ALPHA_SIZE * 2 ]; 

   for (i = 0; i < alphaSize; i++)
      weight[i+1] = (freq[i] == 0 ? 1 : freq[i]) << 8;

   while (True) {

      nNodes = alphaSize;
      nHeap = 0;

      heap[0] = 0;
      weight[0] = 0;
      parent[0] = -2;

      for (i = 1; i <= alphaSize; i++) {
         parent[i] = -1;
         nHeap++;
         heap[nHeap] = i;
         UPHEAP(nHeap);
      }

      AssertH( nHeap < (BZ_MAX_ALPHA_SIZE+2), 2001 );
   
      while (nHeap > 1) {
         n1 = heap[1]; heap[1] = heap[nHeap]; nHeap--; DOWNHEAP(1);
         n2 = heap[1]; heap[1] = heap[nHeap]; nHeap--; DOWNHEAP(1);
         nNodes++;
         parent[n1] = parent[n2] = nNodes;
         weight[nNodes] = ADDWEIGHTS(weight[n1], weight[n2]);
         parent[nNodes] = -1;
         nHeap++;
         heap[nHeap] = nNodes;
         UPHEAP(nHeap);
      }

      AssertH( nNodes < (BZ_MAX_ALPHA_SIZE * 2), 2002 );

      tooLong = False;
      for (i = 1; i <= alphaSize; i++) {
         j = 0;
         k = i;
         while (parent[k] >= 0) { k = parent[k]; j++; }
         len[i-1] = j;
         if (j > maxLen) tooLong = True;
      }
      
      if (! tooLong) break;

      /* 17 Oct 04: keep-going condition for the following loop used
         to be 'i < alphaSize', which missed the last element,
         theoretically leading to the possibility of the compressor
         looping.  However, this count-scaling step is only needed if
         one of the generated Huffman code words is longer than
         maxLen, which up to and including version 1.0.2 was 20 bits,
         which is extremely unlikely.  In version 1.0.3 maxLen was
         changed to 17 bits, which has minimal effect on compression
         ratio, but does mean this scaling step is used from time to
         time, enough to verify that it works.

         This means that bzip2-1.0.3 and later will only produce
         Huffman codes with a maximum length of 17 bits.  However, in
         order to preserve backwards compatibility with bitstreams
         produced by versions pre-1.0.3, the decompressor must still
         handle lengths of up to 20. */

      for (i = 1; i <= alphaSize; i++) {
         j = weight[i] >> 8;
         j = 1 + (j / 2);
         weight[i] = j << 8;
      }
   }
}